

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::password::password(password *this)

{
  string local_38;
  
  base_widget::base_widget((base_widget *)&(this->super_text).super_base_html_input.field_0x98);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"password","");
  text::text(&this->super_text,&PTR_construction_vtable_24__00286c30,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_text).super_base_html_input._vptr_base_html_input = (_func_int **)0x286b18;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x98 = 0x286bd8;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x30 = 0x286b60;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x88 = 0;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x90 = 0;
  return;
}

Assistant:

password::password() : text("password"), password_to_check_(0)
{
}